

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

int addMerkleNodes(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,uint8_t *input,
                  size_t inputSize)

{
  uint uVar1;
  size_t sVar2;
  uint *__ptr;
  size_t __n;
  int iVar3;
  size_t sVar4;
  size_t revealedSize;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedMerkleNodes(tree,missingLeaves,missingLeavesSize,&local_38);
  sVar2 = local_38;
  iVar3 = -1;
  if (__ptr != (uint *)0x0) {
    __n = (size_t)tree->dataSize;
    if (local_38 * __n - inputSize == 0) {
      if (local_38 != 0) {
        sVar4 = 0;
        do {
          uVar1 = __ptr[sVar4];
          memcpy(tree->nodes + (int)__n * uVar1,input,__n);
          uVar1 = uVar1 * 2;
          __n = (size_t)tree->dataSize;
          sVar4 = sVar4 + 1;
          tree->haveNodeExists[uVar1 >> 6] =
               tree->haveNodeExists[uVar1 >> 6] | 1L << ((ulong)(uVar1 + 1) & 0x3f);
          input = input + __n;
        } while (sVar2 != sVar4);
      }
      iVar3 = 0;
    }
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int addMerkleNodes(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize, uint8_t* input,
                   size_t inputSize) {
  assert(missingLeavesSize < tree->numLeaves);

  int ret             = -1;
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    goto Exit;
  }
  assert(!contains(revealed, revealedSize, 0));

  if (inputSize != revealedSize * tree->dataSize) {
    goto Exit;
  }

  /* Deserialize input */
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * tree->dataSize], input, tree->dataSize);
    input += tree->dataSize;
    markNode(tree, revealed[i]);
  }
  ret = 0;

Exit:
  free(revealed);

  return ret;
}